

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestProgress::testVertBar(TestProgress *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Orientation OVar4;
  int iVar5;
  ProgressBar p;
  QWidget w;
  QVBoxLayout l;
  QSignalSpy spy;
  ProgressBar PStack_128;
  QSize local_f8 [5];
  QVBoxLayout local_d0 [32];
  undefined8 local_b0;
  QSignalSpy local_a8;
  
  QWidget::QWidget((QWidget *)local_f8,0,0);
  QVBoxLayout::QVBoxLayout(local_d0);
  QWidget::setLayout((QLayout *)local_f8);
  QtMWidgets::ProgressBar::ProgressBar(&PStack_128,(QWidget *)0x0);
  QBoxLayout::addWidget(local_d0,&PStack_128,0,0);
  QWidget::show();
  bVar1 = (bool)QTest::qWaitForWindowActive((QWidget *)local_f8,5000);
  cVar2 = QTest::qVerify(bVar1,"QTest::qWaitForWindowActive( &w )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                         ,0x54);
  if (cVar2 != '\0') {
    QSignalSpy::QSignalSpy<void(QtMWidgets::ProgressBar::*)(int)>(&local_a8,&PStack_128,0x153818);
    QtMWidgets::ProgressBar::setMinimum(&PStack_128,0);
    QtMWidgets::ProgressBar::setMaximum(&PStack_128,100);
    QtMWidgets::ProgressBar::setValue(&PStack_128,1);
    QtMWidgets::ProgressBar::setOrientation(&PStack_128,Vertical);
    local_b0 = 0x9600000032;
    QWidget::resize(local_f8);
    iVar3 = QtMWidgets::ProgressBar::minimum(&PStack_128);
    cVar2 = QTest::qVerify(iVar3 == 0,"p.minimum() == 0","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                           ,0x5f);
    if (cVar2 != '\0') {
      iVar3 = QtMWidgets::ProgressBar::maximum(&PStack_128);
      cVar2 = QTest::qVerify(iVar3 == 100,"p.maximum() == 100","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                             ,0x60);
      if (cVar2 != '\0') {
        iVar3 = QtMWidgets::ProgressBar::value(&PStack_128);
        cVar2 = QTest::qVerify(iVar3 == 1,"p.value() == 1","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                               ,0x61);
        if (cVar2 != '\0') {
          OVar4 = QtMWidgets::ProgressBar::orientation(&PStack_128);
          cVar2 = QTest::qVerify(OVar4 == Vertical,"p.orientation() == Qt::Vertical","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                 ,0x62);
          if (cVar2 != '\0') {
            bVar1 = QtMWidgets::ProgressBar::invertedAppearance(&PStack_128);
            cVar2 = QTest::qVerify(!bVar1,"p.invertedAppearance() == false","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                   ,99);
            if (cVar2 != '\0') {
              cVar2 = QTest::qVerify(local_a8.super_QList<QList<QVariant>_>.d.size == 1,
                                     "spy.count() == 1","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                     ,100);
              if (cVar2 != '\0') {
                iVar3 = QtMWidgets::ProgressBar::minimum(&PStack_128);
                while( true ) {
                  iVar5 = QtMWidgets::ProgressBar::maximum(&PStack_128);
                  if (iVar5 < iVar3) break;
                  QtMWidgets::ProgressBar::setValue(&PStack_128,iVar3);
                  iVar5 = QtMWidgets::ProgressBar::value(&PStack_128);
                  cVar2 = QTest::qVerify(iVar3 == iVar5,"p.value() == i","",
                                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                         ,0x69);
                  if (cVar2 == '\0') goto LAB_0014eca9;
                  QTest::qWait(0x32);
                  iVar3 = iVar3 + 10;
                }
                QtMWidgets::ProgressBar::reset(&PStack_128);
                QTest::qWait(0x226);
                QtMWidgets::ProgressBar::setInvertedAppearance(&PStack_128,true);
                bVar1 = QtMWidgets::ProgressBar::invertedAppearance(&PStack_128);
                cVar2 = QTest::qVerify(bVar1,"p.invertedAppearance() == true","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                       ,0x72);
                if (cVar2 != '\0') {
                  iVar3 = QtMWidgets::ProgressBar::minimum(&PStack_128);
                  while( true ) {
                    iVar5 = QtMWidgets::ProgressBar::maximum(&PStack_128);
                    if (iVar5 < iVar3) break;
                    QtMWidgets::ProgressBar::setValue(&PStack_128,iVar3);
                    iVar5 = QtMWidgets::ProgressBar::value(&PStack_128);
                    cVar2 = QTest::qVerify(iVar3 == iVar5,"p.value() == i","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/progress/main.cpp"
                                           ,0x77);
                    if (cVar2 == '\0') break;
                    QTest::qWait(0x32);
                    iVar3 = iVar3 + 10;
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_0014eca9:
    local_a8._0_8_ = &PTR_metaObject_00197520;
    QObject::~QObject((QObject *)((long)&local_a8 + 0x58));
    if (&(local_a8.args.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_a8.args.d.d)->super_QArrayData,4,8);
      }
    }
    if (&(local_a8.sig.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_a8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_a8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_a8.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_a8.sig.d.d)->super_QArrayData,1,8);
      }
    }
    QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QVariant>_> *)((long)&local_a8 + 0x10));
    QObject::~QObject(&local_a8.super_QObject);
  }
  QtMWidgets::ProgressBar::~ProgressBar(&PStack_128);
  QVBoxLayout::~QVBoxLayout(local_d0);
  QWidget::~QWidget((QWidget *)local_f8);
  return;
}

Assistant:

void testVertBar()
	{
		QWidget w;
		QVBoxLayout l;
		w.setLayout( &l );
		QtMWidgets::ProgressBar p;
		l.addWidget( &p );

		w.show();

		QVERIFY( QTest::qWaitForWindowActive( &w ) );

		QSignalSpy spy( &p, &QtMWidgets::ProgressBar::valueChanged );

		p.setMinimum( 0 );
		p.setMaximum( 100 );
		p.setValue( 1 );
		p.setOrientation( Qt::Vertical );

		w.resize( 50, 150 );

		QVERIFY( p.minimum() == 0 );
		QVERIFY( p.maximum() == 100 );
		QVERIFY( p.value() == 1 );
		QVERIFY( p.orientation() == Qt::Vertical );
		QVERIFY( p.invertedAppearance() == false );
		QVERIFY( spy.count() == 1 );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}

		p.reset();
		QTest::qWait( 550 );

		p.setInvertedAppearance( true );

		QVERIFY( p.invertedAppearance() == true );

		for( int i = p.minimum(); i <= p.maximum(); i += 10 )
		{
			p.setValue( i );
			QVERIFY( p.value() == i );
			QTest::qWait( 50 );
		}
	}